

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeadReckoningCalculator.cpp
# Opt level: O0

void __thiscall
KDIS::UTILS::DeadReckoningCalculator::computeDRMatrix
          (DeadReckoningCalculator *this,TMATRIX *res,KFLOAT32 totalTimeSinceReset)

{
  double dVar1;
  Matrix<float,_(unsigned_char)__x03_,_(unsigned_char)__x03_> local_84;
  double local_60;
  KFLOAT64 f64SkewScalar;
  KFLOAT64 fwwScalar;
  double dStack_48;
  KFLOAT32 f64CosMagDelta;
  KFLOAT64 f64DeltaMag;
  TMATRIX I;
  KFLOAT32 totalTimeSinceReset_local;
  TMATRIX *res_local;
  DeadReckoningCalculator *this_local;
  
  I.Data[2][1] = (float)totalTimeSinceReset;
  unique0x1000011f = (Matrix<float,(unsigned_char)3,(unsigned_char)3> *)res;
  Matrix<float,_(unsigned_char)'\x03',_(unsigned_char)'\x03'>::Matrix
            ((Matrix<float,_(unsigned_char)__x03_,_(unsigned_char)__x03_> *)&f64DeltaMag);
  dStack_48 = (double)(I.Data[2][1] * (float)this->m_f64Magnitude);
  if (dStack_48 <= 1e-05) {
    memcpy(stack0xffffffffffffffe8,&f64DeltaMag,0x24);
  }
  else {
    dVar1 = cos(dStack_48);
    fwwScalar._4_4_ = (float)dVar1;
    f64SkewScalar =
         (KFLOAT64)
         (double)((1.0 - fwwScalar._4_4_) /
                 ((float)this->m_f64Magnitude * (float)this->m_f64Magnitude));
    memcpy(stack0xffffffffffffffe8,&this->m_wwMatrix,0x24);
    Matrix<float,(unsigned_char)3,(unsigned_char)3>::operator*=
              (stack0xffffffffffffffe8,(double)f64SkewScalar);
    Matrix<float,(unsigned_char)3,(unsigned_char)3>::operator*=
              ((Matrix<float,(unsigned_char)3,(unsigned_char)3> *)&f64DeltaMag,fwwScalar._4_4_);
    local_60 = sin(dStack_48);
    local_60 = local_60 / (double)(float)this->m_f64Magnitude;
    Matrix<float,_(unsigned_char)'\x03',_(unsigned_char)'\x03'>::operator+=
              ((Matrix<float,_(unsigned_char)__x03_,_(unsigned_char)__x03_> *)
               stack0xffffffffffffffe8,
               (Matrix<float,_(unsigned_char)__x03_,_(unsigned_char)__x03_> *)&f64DeltaMag);
    Matrix<float,(unsigned_char)3,(unsigned_char)3>::operator*
              (&local_84,(Matrix<float,(unsigned_char)3,(unsigned_char)3> *)&this->m_SkewOmegaMatrix
               ,local_60);
    Matrix<float,_(unsigned_char)'\x03',_(unsigned_char)'\x03'>::operator-=
              ((Matrix<float,_(unsigned_char)__x03_,_(unsigned_char)__x03_> *)
               stack0xffffffffffffffe8,&local_84);
  }
  return;
}

Assistant:

void DeadReckoningCalculator::computeDRMatrix( TMATRIX& res, const KFLOAT32 totalTimeSinceReset )
{
    TMATRIX I;
    const KFLOAT64 f64DeltaMag = totalTimeSinceReset * m_f64Magnitude;
    if( f64DeltaMag > MAGIC_EPSILON )
    {
        const KFLOAT32 f64CosMagDelta = cos( f64DeltaMag );
        const KFLOAT64 fwwScalar = ( 1 - f64CosMagDelta ) / ( m_f64Magnitude * m_f64Magnitude );
        res = m_wwMatrix;
        res *= fwwScalar;
        I *= f64CosMagDelta;
        const KFLOAT64 f64SkewScalar = sin( f64DeltaMag ) / m_f64Magnitude;
        res += I;
        res -= ( m_SkewOmegaMatrix * f64SkewScalar );
    }
    else
    {
        res = I; // Identity matrix
    }
}